

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_Disown(cmsysProcess *cp)

{
  if ((((cp != (cmsysProcess *)0x0) && (cp->Detached != 0)) && (cp->State == 3)) &&
     ((cp->TimeoutExpired == 0 && (cp->Killed == 0)))) {
    kwsysProcessClosePipes(cp);
    kwsysProcessCleanup(cp,0);
    cp->State = 7;
  }
  return;
}

Assistant:

kwsysEXPORT void kwsysProcess_Disown(kwsysProcess* cp)
{
  /* Make sure a detached child process is running.  */
  if(!cp || !cp->Detached || cp->State != kwsysProcess_State_Executing ||
     cp->TimeoutExpired || cp->Killed)
    {
    return;
    }

  /* Close all the pipes safely.  */
  kwsysProcessClosePipes(cp);

  /* We will not wait for exit, so cleanup now.  */
  kwsysProcessCleanup(cp, 0);

  /* The process has been disowned.  */
  cp->State = kwsysProcess_State_Disowned;
}